

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

type_error *
nlohmann::detail::type_error::create(type_error *__return_storage_ptr__,int id_,string *what_arg)

{
  long *plVar1;
  size_type *psVar2;
  string local_88;
  string local_68;
  size_type *local_48;
  string w;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"type_error","");
  exception::name(&local_88,&local_68,id_);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)(what_arg->_M_dataplus)._M_p);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar2) {
    w._M_string_length = *psVar2;
    w.field_2._M_allocated_capacity = plVar1[3];
    local_48 = &w._M_string_length;
  }
  else {
    w._M_string_length = *psVar2;
    local_48 = (size_type *)*plVar1;
  }
  w._M_dataplus._M_p = (pointer)plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  exception::exception(&__return_storage_ptr__->super_exception,id_,(char *)local_48);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_0014b8e8;
  if (local_48 != &w._M_string_length) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static type_error create(int id_, const std::string& what_arg)
    {
        std::string w = exception::name("type_error", id_) + what_arg;
        return type_error(id_, w.c_str());
    }